

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O0

void __thiscall sqlite::database_binder::~database_binder(database_binder *this)

{
  bool bVar1;
  database_binder *this_local;
  
  bVar1 = used(this);
  if (((!bVar1) &&
      (bVar1 = utility::UncaughtExceptionDetector::operator_cast_to_bool
                         (&this->_has_uncaught_exception), !bVar1)) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->_stmt), bVar1)) {
    execute(this);
  }
  std::unique_ptr<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>::~unique_ptr(&this->_stmt);
  std::shared_ptr<sqlite3>::~shared_ptr(&this->_db);
  return;
}

Assistant:

~database_binder() noexcept(false) {
			/* Will be executed if no >>op is found, but not if an exception
			is in mid flight */
			if(!used() && !_has_uncaught_exception && _stmt) {
				execute();
			}
		}